

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall WriterTest_WriteLongDouble_Test::TestBody(WriterTest_WriteLongDouble_Test *this)

{
  longdouble lVar1;
  bool bVar2;
  undefined7 uVar3;
  undefined2 uVar4;
  longdouble *in_RDX;
  char *type;
  longdouble *extraout_RDX;
  longdouble *extraout_RDX_00;
  longdouble *value;
  longdouble *value_00;
  char *pcVar5;
  AssertionResult gtest_ar_2;
  longdouble local_58;
  AssertHelper local_48;
  wstring str;
  
  gtest_ar_2.success_ = SUB101(_DAT_001e4010,0);
  bVar2 = gtest_ar_2.success_;
  gtest_ar_2._1_7_ = SUB107((unkuint10)_DAT_001e4010 >> 8,0);
  uVar3 = gtest_ar_2._1_7_;
  gtest_ar_2.message_.ptr_._0_2_ = (undefined2)((unkuint10)_DAT_001e4010 >> 0x40);
  uVar4 = gtest_ar_2.message_.ptr_._0_2_;
  (anonymous_namespace)::AnyWriteChecker::operator()(&str,&gtest_ar_2.success_,in_RDX);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (str._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x28a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&str._M_string_length);
  lVar1 = _DAT_001e4020;
  gtest_ar_2.success_ = SUB101(_DAT_001e4020,0);
  gtest_ar_2._1_7_ = SUB107((unkuint10)_DAT_001e4020 >> 8,0);
  gtest_ar_2.message_.ptr_._0_2_ = (undefined2)((unkuint10)_DAT_001e4020 >> 0x40);
  (anonymous_namespace)::check_write<char,long_double>
            ((_anonymous_namespace_ *)&str,(longdouble *)&gtest_ar_2,type);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (str._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x28b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&str._M_string_length);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = L'\0';
  gtest_ar_2.success_ = bVar2;
  gtest_ar_2._1_7_ = uVar3;
  gtest_ar_2.message_.ptr_._0_2_ = uVar4;
  (anonymous_namespace)::std_format<wchar_t,long_double>((longdouble *)&gtest_ar_2,&str);
  if (*str._M_dataplus._M_p == L'-') {
    fmt::v5::print<char[61]>
              ((char (*) [61])"warning: long double formatting with std::swprintf is broken");
    value = extraout_RDX;
  }
  else {
    local_58 = lVar1;
    (anonymous_namespace)::check_write<wchar_t,long_double>
              ((_anonymous_namespace_ *)&gtest_ar_2,&local_58,"char");
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)CONCAT62(gtest_ar_2.message_.ptr_._2_6_,gtest_ar_2.message_.ptr_._0_2_) ==
          (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)CONCAT62(gtest_ar_2.message_.ptr_._2_6_,gtest_ar_2.message_.ptr_._0_2_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                 ,0x28f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_58);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    value = extraout_RDX_00;
  }
  local_58 = _DAT_001e4030;
  (anonymous_namespace)::AnyWriteChecker::operator()(&gtest_ar_2,(char *)&local_58,value);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)CONCAT62(gtest_ar_2.message_.ptr_._2_6_,gtest_ar_2.message_.ptr_._0_2_) ==
        (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT62(gtest_ar_2.message_.ptr_._2_6_,gtest_ar_2.message_.ptr_._0_2_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x292,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_58 = _DAT_001e4040;
  (anonymous_namespace)::AnyWriteChecker::operator()(&gtest_ar_2,(char *)&local_58,value_00);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)CONCAT62(gtest_ar_2.message_.ptr_._2_6_,gtest_ar_2.message_.ptr_._0_2_) ==
        (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT62(gtest_ar_2.message_.ptr_._2_6_,gtest_ar_2.message_.ptr_._0_2_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x293,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::wstring::~wstring((wstring *)&str);
  return;
}

Assistant:

TEST(WriterTest, WriteLongDouble) {
  CHECK_WRITE(4.2l);
  CHECK_WRITE_CHAR(-4.2l);
  std::wstring str;
  std_format(4.2l, str);
  if (str[0] != '-')
    CHECK_WRITE_WCHAR(-4.2l);
  else
    fmt::print("warning: long double formatting with std::swprintf is broken");
  CHECK_WRITE(std::numeric_limits<long double>::min());
  CHECK_WRITE(std::numeric_limits<long double>::max());
}